

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visit.cpp
# Opt level: O3

value_type * __thiscall
(anonymous_namespace)::serialize_and_visit<(anonymous_namespace)::ToString,test::LargeEnumClass>
          (value_type *__return_storage_ptr__,_anonymous_namespace_ *this,LargeEnumClass *in)

{
  uint *puVar1;
  long lVar2;
  value_type *pvVar3;
  string_view full_tag;
  string_view tag_00;
  InputStream istream;
  ToString visitor;
  cx_string<100UL> tag;
  stringstream stream;
  InputStream local_3a0;
  undefined8 local_398 [2];
  long local_388;
  uint auStack_370 [22];
  ios_base aiStack_318 [267];
  char local_20d [101];
  long local_1a8 [2];
  char local_198 [12];
  undefined4 auStack_18c [25];
  ios_base aiStack_128 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  lVar2 = *(long *)(local_1a8[0] + -0x18);
  *(undefined4 *)((long)auStack_18c + lVar2) = 4;
  std::ios::clear((int)&stack0xfffffffffffffc58 + (int)lVar2 + 0x200);
  local_398[0] = *(undefined8 *)this;
  std::ostream::write(local_198,(long)local_398);
  std::__cxx11::stringstream::stringstream((stringstream *)local_398);
  puVar1 = (uint *)((long)auStack_370 + *(long *)(local_388 + -0x18));
  *puVar1 = *puVar1 | 1;
  local_3a0.stream = (stringstream *)local_1a8;
  mserialize::CustomTag<test::LargeEnumClass,_void>::tag_string();
  full_tag._len = 100;
  full_tag._ptr = local_20d;
  tag_00._len = 100;
  tag_00._ptr = local_20d;
  mserialize::detail::visit_impl<(anonymous_namespace)::ToString,InputStream>
            (full_tag,tag_00,(ToString *)local_398,&local_3a0,0x800);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_398);
  std::ios_base::~ios_base(aiStack_318);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  pvVar3 = (value_type *)std::ios_base::~ios_base(aiStack_128);
  return pvVar3;
}

Assistant:

typename Visitor::value_type
serialize_and_visit(const T& in)
{
  std::stringstream stream;
  stream.exceptions(std::ios_base::failbit);

  // serialize
  OutputStream ostream{stream};
  mserialize::serialize(in, ostream);

  // visit
  Visitor visitor;
  InputStream istream{stream};
  const auto tag = mserialize::tag<T>();
  mserialize::visit(tag, visitor, istream);

  return visitor.value();
}